

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *compilation,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,
          ASTContext *context,uint32_t constructIndex)

{
  uint uVar1;
  Type *lhs;
  pointer ppGVar2;
  __index_type _Var3;
  bool bVar4;
  int iVar5;
  MemberSyntax *pMVar6;
  GenerateBlockArraySymbol *this;
  Scope *pSVar7;
  GenerateBlockArraySymbol *pGVar8;
  ExpressionSyntax *pEVar9;
  SourceLocation location;
  Expression *pEVar10;
  StatementBlockSymbol *pSVar11;
  VariableSymbol *symbol;
  undefined4 extraout_var;
  Expression *this_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar12;
  Diagnostic *pDVar13;
  ulong uVar14;
  Symbol *pSVar15;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  size_type extraout_RDX_01;
  DiagCode code;
  long lVar16;
  long lVar17;
  ulong uVar18;
  pointer pSVar19;
  Token TVar20;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  string_view sVar21;
  SourceRange SVar22;
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar23;
  LookupLocation LVar24;
  LookupLocation location_00;
  Token genvar;
  SourceLocation loc;
  uint32_t constructIndex_local;
  ConstantValue stop;
  anon_class_40_5_68e605a5 createBlock;
  ConstantValue initialVal;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  ASTContext iterContext;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_4b0;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_488;
  string_view name;
  SmallVector<slang::SVInt,_8UL> indices;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_390;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_368;
  EvalContext evalContext;
  SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
  usedValues;
  undefined4 extraout_var_00;
  
  constructIndex_local = constructIndex;
  pMVar6 = not_null<slang::syntax::MemberSyntax_*>::get(&syntax->block);
  name = getGenerateBlockName(&pMVar6->super_SyntaxNode);
  pMVar6 = not_null<slang::syntax::MemberSyntax_*>::get(&syntax->block);
  TVar20 = slang::syntax::SyntaxNode::getFirstToken(&pMVar6->super_SyntaxNode);
  evalContext.compilation._0_4_ = TVar20._0_4_;
  evalContext.compilation._4_4_ = TVar20.rawLen;
  evalContext._8_4_ = TVar20.info._0_4_;
  evalContext.steps = TVar20.info._4_4_;
  loc = parsing::Token::location((Token *)&evalContext);
  this = BumpAllocator::
         emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                   (&compilation->super_BumpAllocator,compilation,&name,&loc,&constructIndex_local);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this->super_Symbol,pSVar7,syntax_00);
  genvar.kind = (syntax->identifier).kind;
  genvar._2_1_ = (syntax->identifier).field_0x2;
  genvar.numFlags.raw = (syntax->identifier).numFlags;
  genvar.rawLen = (syntax->identifier).rawLen;
  genvar.info = (syntax->identifier).info;
  if ((genvar._0_8_ & 0x10000) != 0) {
    return this;
  }
  pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  lVar17 = 0;
  do {
    pSVar15 = pSVar7->thisSym;
    if (pSVar15->kind != GenerateBlock) {
      if (pSVar15->kind != GenerateBlockArray) break;
      pGVar8 = Symbol::as<slang::ast::GenerateBlockArraySymbol>(pSVar15);
      lVar17 = (lVar17 + (ulong)(lVar17 == 0)) * (pGVar8->entries).size_;
    }
    pSVar7 = pSVar15->parentScope;
  } while (pSVar7 != (Scope *)0x0);
  uVar18 = lVar17 + (ulong)(lVar17 == 0);
  uVar1 = (compilation->options).maxGenerateSteps;
  if ((syntax->genvar).info == (Info *)0x0) {
    pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
    sVar21 = parsing::Token::valueText(&genvar);
    LVar24 = ASTContext::getLocation(context);
    SVar22 = parsing::Token::range(&genvar);
    location_00._12_4_ = 0;
    location_00.scope = (Scope *)SUB128(LVar24._0_12_,0);
    location_00.index = SUB124(LVar24._0_12_,8);
    pSVar15 = Lookup::unqualifiedAt
                        (pSVar7,sVar21,location_00,SVar22,(bitmask<slang::ast::LookupFlags>)0x0);
    if (pSVar15 == (Symbol *)0x0) {
      return this;
    }
    if (pSVar15->kind != Genvar) {
      SVar22 = parsing::Token::range(&genvar);
      pDVar13 = ASTContext::addDiag(context,(DiagCode)0x1a000a,SVar22);
      sVar21 = parsing::Token::valueText(&genvar);
      Diagnostic::operator<<(pDVar13,sVar21);
      Diagnostic::addNote(pDVar13,(DiagCode)0x40001,pSVar15->location);
      return this;
    }
  }
  entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ =
       (pointer)entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.firstElement;
  entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len = 0;
  entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.cap = 5;
  createBlock.genvar = &genvar;
  createBlock.entries = &entries;
  lhs = compilation->integerType;
  createBlock.compilation = compilation;
  createBlock.loc = &loc;
  createBlock.syntax = syntax;
  pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->initialExpr);
  location = parsing::Token::location(&syntax->equals);
  pEVar10 = Expression::bindRValue(lhs,pEVar9,location,context,(bitmask<slang::ast::ASTFlags>)0x0);
  ASTContext::eval(&initialVal,context,pEVar10,(bitmask<slang::ast::EvalFlags>)0x0);
  if (initialVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index != '\0') {
    evalContext.compilation._0_4_ = 0;
    usedValues.super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>.buffer.
    _0_8_ = usedValues.super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>.
            buffer._0_8_ & 0xffffffff00000000;
    pSVar11 = BumpAllocator::
              emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                        (&compilation->super_BumpAllocator,compilation,(char (*) [1])0x344831,&loc,
                         (StatementBlockKind *)&evalContext,(VariableLifetime *)&usedValues);
    sVar21 = parsing::Token::valueText(&genvar);
    evalContext.compilation._0_4_ = (undefined4)sVar21._M_len;
    evalContext.compilation._4_4_ = sVar21._M_len._4_4_;
    evalContext._8_4_ = sVar21._M_str._0_4_;
    evalContext.steps = sVar21._M_str._4_4_;
    usedValues.super_StackAllocStorage<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>.buffer.
    _0_8_ = parsing::Token::location(&genvar);
    indices.super_SmallVectorBase<slang::SVInt>.data_ =
         (pointer)((ulong)indices.super_SmallVectorBase<slang::SVInt>.data_._4_4_ << 0x20);
    symbol = BumpAllocator::
             emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                       (&compilation->super_BumpAllocator,
                        (basic_string_view<char,_std::char_traits<char>_> *)&evalContext,
                        (SourceLocation *)&usedValues,(VariableLifetime *)&indices);
    (symbol->super_ValueSymbol).declaredType.type = compilation->integerType;
    *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 2;
    pSVar7 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
    (pSVar11->super_Symbol).parentScope = pSVar7;
    (pSVar11->super_Symbol).indexInScope = scopeIndex;
    Scope::addMember(&pSVar11->super_Scope,(Symbol *)symbol);
    LVar24._12_4_ = 0;
    LVar24.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
    LVar24.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
    ASTContext::ASTContext
              (&iterContext,&pSVar11->super_Scope,LVar24,(bitmask<slang::ast::ASTFlags>)0x0);
    pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->stopExpr);
    iVar5 = Expression::bind((int)pEVar9,(sockaddr *)&iterContext,0);
    pEVar10 = (Expression *)CONCAT44(extraout_var,iVar5);
    pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->iterationExpr);
    iVar5 = Expression::bind((int)pEVar9,(sockaddr *)&iterContext,0x20);
    this_00 = (Expression *)CONCAT44(extraout_var_00,iVar5);
    bVar4 = Expression::bad(pEVar10);
    if (!bVar4) {
      bVar4 = Expression::bad(this_00);
      if (!bVar4) {
        bVar4 = ASTContext::requireBooleanConvertible(context,pEVar10);
        if (bVar4) {
          evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
               (pointer)evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                        firstElement;
          evalContext._8_4_ = evalContext._8_4_ & 0xffffff00;
          evalContext.steps = 0;
          evalContext.disableTarget._0_4_ = 0;
          evalContext._20_8_ = 0;
          evalContext.queueTarget._4_4_ = 0;
          evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
          evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
          evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
               (pointer)evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                        firstElement;
          evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
          evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
          evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.data_ =
               (pointer)evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                        super_SmallVectorBase<slang::Diagnostic>.firstElement;
          evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len = 0;
          evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.cap = 2;
          evalContext.disableRange.startLoc = (SourceLocation)0x0;
          evalContext.disableRange.endLoc = (SourceLocation)0x0;
          evalContext.compilation = compilation;
          EvalContext::pushEmptyFrame(&evalContext);
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_4b0,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&initialVal);
          __v = &EvalContext::createLocal
                           (&evalContext,&symbol->super_ValueSymbol,(ConstantValue *)&local_4b0)->
                 value;
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage(&local_4b0);
          pvVar12 = std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              (__v);
          if ((pvVar12->super_SVIntStorage).unknownFlag == true) {
            SVar22 = parsing::Token::range(&genvar);
            pDVar13 = ASTContext::addDiag(&iterContext,(DiagCode)0x280006,SVar22);
            Diagnostic::operator<<(pDVar13,(ConstantValue *)__v);
          }
          SmallSet<slang::SVInt,_8UL,_ska::detailv3::sherwood_v3_entry<slang::SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          ::SmallSet(&usedValues);
          indices.super_SmallVectorBase<slang::SVInt>.data_ =
               (pointer)indices.super_SmallVectorBase<slang::SVInt>.firstElement;
          indices.super_SmallVectorBase<slang::SVInt>.len = 0;
          indices.super_SmallVectorBase<slang::SVInt>.cap = 8;
          for (uVar14 = uVar18; uVar14 <= uVar1; uVar14 = uVar14 + uVar18) {
            Expression::eval(&stop,pEVar10,&evalContext);
            if (stop.value.
                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ._M_index == '\0') {
              bVar4 = false;
LAB_0019e6bf:
              this->valid = bVar4;
LAB_0019e70d:
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&stop);
              if (indices.super_SmallVectorBase<slang::SVInt>.len == 0) {
                Expression::eval((ConstantValue *)&local_390,this_00,&evalContext);
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage(&local_390);
              }
              EvalContext::reportDiags(&evalContext,&iterContext);
              src = extraout_RDX;
              if (this->valid == true) {
                pSVar19 = indices.super_SmallVectorBase<slang::SVInt>.data_;
                for (lVar17 = indices.super_SmallVectorBase<slang::SVInt>.len << 4; lVar17 != 0;
                    lVar17 = lVar17 + -0x10) {
                  std::__detail::__variant::
                  _Variant_storage<false,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                  ::_Variant_storage<1ul,slang::SVInt_const&>
                            ((_Variant_storage<false,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              *)&local_3b8,pSVar19);
                  fromSyntax::anon_class_40_5_68e605a5::operator()
                            (&createBlock,(ConstantValue *)&local_3b8,true);
                  std::__detail::__variant::
                  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  ::~_Variant_storage(&local_3b8);
                  pSVar19 = pSVar19 + 1;
                  src = extraout_RDX_00;
                }
              }
              iVar5 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                                (&entries.
                                  super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>,
                                 (EVP_PKEY_CTX *)compilation,src);
              ppGVar2 = entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_
              ;
              (this->entries).data_ = (pointer)CONCAT44(extraout_var_01,iVar5);
              (this->entries).size_ = extraout_RDX_01;
              if (entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len == 0) {
                SVInt::SVInt((SVInt *)&stop,0x20,0,true);
                std::
                variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                ::variant<slang::SVInt,void,void,slang::SVInt,void>
                          ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            *)&local_488,(SVInt *)&stop);
                fromSyntax::anon_class_40_5_68e605a5::operator()
                          (&createBlock,(ConstantValue *)&local_488,false);
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage(&local_488);
                SVInt::~SVInt((SVInt *)&stop);
              }
              else {
                lVar17 = entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len
                         << 3;
                for (lVar16 = 0; lVar17 != lVar16; lVar16 = lVar16 + 8) {
                  Scope::addMember(&this->super_Scope,*(Symbol **)((long)ppGVar2 + lVar16));
                }
              }
              goto LAB_0019e868;
            }
            bVar4 = ConstantValue::isTrue(&stop);
            if (!bVar4) {
              bVar4 = stop.value.
                      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      ._M_index != '\0';
              goto LAB_0019e6bf;
            }
            pvVar12 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                (__v);
            SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
                      (&indices.super_SmallVectorBase<slang::SVInt>,pvVar12);
            pvVar12 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                (__v);
            pVar23 = ska::detailv3::
                     sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                     ::emplace<slang::SVInt&>
                               ((sherwood_v3_table<slang::SVInt,slang::SVInt,std::hash<slang::SVInt>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::SVInt>>,std::equal_to<slang::SVInt>,ska::detailv3::functor_storage<bool,std::equal_to<slang::SVInt>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,8ul>>
                                 *)&usedValues.
                                    super_flat_hash_set<slang::SVInt,_std::hash<SVInt>,_std::equal_to<SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                                ,pvVar12);
            if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              SVar22 = parsing::Token::range(&genvar);
              code.subsystem = Declarations;
              code.code = 0x27;
LAB_0019e6f2:
              pDVar13 = ASTContext::addDiag(&iterContext,code,SVar22);
              Diagnostic::operator<<(pDVar13,(ConstantValue *)__v);
              goto LAB_0019e70d;
            }
            Expression::eval((ConstantValue *)&local_368,this_00,&evalContext);
            _Var3 = local_368._M_index;
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_368);
            if (_Var3 == '\0') goto LAB_0019e70d;
            pvVar12 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                (__v);
            if ((pvVar12->super_SVIntStorage).unknownFlag == true) {
              SVar22 = parsing::Token::range(&genvar);
              code.subsystem = Declarations;
              code.code = 0x28;
              goto LAB_0019e6f2;
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&stop);
          }
          SVar22 = parsing::Token::range(&syntax->keyword);
          ASTContext::addDiag(context,(DiagCode)0x500006,SVar22);
LAB_0019e868:
          SmallVectorBase<slang::SVInt>::~SmallVectorBase
                    (&indices.super_SmallVectorBase<slang::SVInt>);
          ska::detailv3::
          sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
          ::~sherwood_v3_table
                    (&usedValues.
                      super_flat_hash_set<slang::SVInt,_std::hash<SVInt>,_std::equal_to<SVInt>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                      .
                      super_sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
                    );
          EvalContext::~EvalContext(&evalContext);
        }
      }
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&initialVal);
  SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::~SmallVectorBase
            (&entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>);
  return this;
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& compilation,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    string_view name = getGenerateBlockName(*syntax.block);
    SourceLocation loc = syntax.block->getFirstToken().location();
    auto result = compilation.emplace<GenerateBlockArraySymbol>(compilation, name, loc,
                                                                constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = compilation.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&](ConstantValue value, bool isInstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = compilation.emplace<GenerateBlockSymbol>(compilation, "", loc, 1u,
                                                              isInstantiated);
        auto implicitParam = compilation.emplace<ParameterSymbol>(
            genvar.valueText(), genvar.location(), true /* isLocal */, false /* isPort */);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        if (isInstantiated)
            addBlockMembers(*block, *syntax.block);

        implicitParam->setType(compilation.getIntegerType());
        implicitParam->setValue(compilation, std::move(value), /* needsCoercion */ false);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(compilation.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.location(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *compilation.emplace<StatementBlockSymbol>(compilation, "", loc,
                                                                 StatementBlockKind::Sequential,
                                                                 VariableLifetime::Automatic);
    auto& local = *compilation.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                       VariableLifetime::Automatic);
    local.setType(compilation.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(compilation);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportDiags(iterContext);

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        for (auto& index : indices)
            createBlock(index, true);
    }

    result->entries = entries.copy(compilation);
    if (entries.empty())
        createBlock(SVInt(32, 0, true), false);
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}